

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O0

Future<RemoveResponse> * __thiscall
NarpcNamenodeClient::Remove(NarpcNamenodeClient *this,Filename *name,bool recursive)

{
  int iVar1;
  long in_RSI;
  Filename *in_RDI;
  shared_ptr<NarpcRemoveResponse> response;
  shared_ptr<RemoveRequest> request;
  shared_ptr<NarpcRemoveResponse> *in_stack_ffffffffffffff28;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff30;
  shared_ptr<AsyncTask<RemoveResponse>_> *task;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Filename *__args;
  shared_ptr<AsyncTask<RemoveResponse>_> local_90;
  undefined4 local_7c;
  shared_ptr<AsyncTask<RemoveResponse>_> local_78 [3];
  long local_48;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc0;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc8;
  RpcClient *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::make_shared<RemoveRequest,crail::Filename&,bool&>
            (in_RDI,(bool *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_48 = in_RSI + 8;
  std::make_shared<NarpcRemoveResponse,RpcClient*>((RpcClient **)__args);
  std::shared_ptr<RpcMessage>::shared_ptr<RemoveRequest,void>
            (in_stack_ffffffffffffff30,(shared_ptr<RemoveRequest> *)in_stack_ffffffffffffff28);
  task = local_78;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcRemoveResponse,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = RpcClient::IssueRequest
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x166ad9);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x166ae3);
  if (iVar1 < 0) {
    Future<RemoveResponse>::Failure();
  }
  else {
    std::shared_ptr<AsyncTask<RemoveResponse>>::shared_ptr<NarpcRemoveResponse,void>
              (&local_90,in_stack_ffffffffffffff28);
    Future<RemoveResponse>::Future
              ((Future<RemoveResponse> *)CONCAT44(iVar1,in_stack_ffffffffffffff50),task);
    std::shared_ptr<AsyncTask<RemoveResponse>_>::~shared_ptr
              ((shared_ptr<AsyncTask<RemoveResponse>_> *)0x166b96);
  }
  local_7c = 1;
  std::shared_ptr<NarpcRemoveResponse>::~shared_ptr((shared_ptr<NarpcRemoveResponse> *)0x166bcd);
  std::shared_ptr<RemoveRequest>::~shared_ptr((shared_ptr<RemoveRequest> *)0x166bda);
  return (Future<RemoveResponse> *)in_RDI;
}

Assistant:

Future<RemoveResponse> NarpcNamenodeClient::Remove(Filename &name,
                                                   bool recursive) {
  shared_ptr<RemoveRequest> request =
      make_shared<RemoveRequest>(name, recursive);
  shared_ptr<NarpcRemoveResponse> response =
      make_shared<NarpcRemoveResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<RemoveResponse>::Failure();
  }
  return Future<RemoveResponse>(response);
}